

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef name_04;
  StringRef name_05;
  StringRef name_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ScopedElement *pSVar1;
  XmlWriter *this_01;
  ScopedElement *attribute;
  TestRunStats *in_RSI;
  StreamingReporterBase *in_RDI;
  size_t in_stack_fffffffffffffe88;
  ScopedElement *in_stack_fffffffffffffe90;
  unsigned_long *in_stack_fffffffffffffe98;
  ScopedElement *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 uVar2;
  XmlFormatting in_stack_fffffffffffffeac;
  undefined4 uVar3;
  string *in_stack_fffffffffffffeb0;
  string *name_07;
  XmlWriter *in_stack_fffffffffffffeb8;
  XmlWriter *this_02;
  XmlFormatting fmt;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined1 local_c9 [81];
  StringRef local_78;
  StringRef local_68;
  allocator<char> local_41;
  string local_40 [64];
  
  StreamingReporterBase::testRunEnded(in_RDI,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  local_68 = operator____sr((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  name.m_start._4_4_ = in_stack_fffffffffffffeac;
  name.m_start._0_4_ = in_stack_fffffffffffffea8;
  name.m_size = (size_type)in_stack_fffffffffffffeb0;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                      (in_stack_fffffffffffffea0,name,in_stack_fffffffffffffe98);
  local_78 = operator____sr((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  name_00.m_start._4_4_ = in_stack_fffffffffffffeac;
  name_00.m_start._0_4_ = in_stack_fffffffffffffea8;
  name_00.m_size = (size_type)in_stack_fffffffffffffeb0;
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                     (in_stack_fffffffffffffea0,name_00,in_stack_fffffffffffffe98);
  local_c9._65_16_ =
       (undefined1  [16])operator____sr((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
  ;
  name_01.m_start._4_4_ = in_stack_fffffffffffffeac;
  name_01.m_start._0_4_ = in_stack_fffffffffffffea8;
  name_01.m_size = (size_type)in_stack_fffffffffffffeb0;
  this_01 = (XmlWriter *)
            XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                      (in_stack_fffffffffffffea0,name_01,in_stack_fffffffffffffe98);
  local_c9._49_16_ =
       (undefined1  [16])operator____sr((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
  ;
  name_02.m_start._4_4_ = in_stack_fffffffffffffeac;
  name_02.m_start._0_4_ = in_stack_fffffffffffffea8;
  name_02.m_size = (size_type)in_stack_fffffffffffffeb0;
  XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
            (in_stack_fffffffffffffea0,name_02,in_stack_fffffffffffffe98);
  XmlWriter::ScopedElement::~ScopedElement(in_stack_fffffffffffffe90);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  name_07 = (string *)&in_RDI[1].super_ReporterBase.super_IEventListener.m_preferences;
  this_02 = (XmlWriter *)local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)pSVar1,(allocator<char> *)this_01);
  operator|(Newline,Indent);
  XmlWriter::scopedElement(this_02,name_07,in_stack_fffffffffffffeac);
  fmt = (XmlFormatting)((ulong)this_02 >> 0x20);
  operator____sr((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  name_03.m_start._4_4_ = in_stack_fffffffffffffeac;
  name_03.m_start._0_4_ = in_stack_fffffffffffffea8;
  name_03.m_size = (size_type)name_07;
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                     (in_stack_fffffffffffffea0,name_03,in_stack_fffffffffffffe98);
  uVar2 = SUB84(pSVar1,0);
  uVar3 = (undefined4)((ulong)pSVar1 >> 0x20);
  operator____sr((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  name_04.m_start._4_4_ = uVar3;
  name_04.m_start._0_4_ = uVar2;
  name_04.m_size = (size_type)name_07;
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                     (in_stack_fffffffffffffea0,name_04,in_stack_fffffffffffffe98);
  operator____sr((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  name_05.m_start._4_4_ = uVar3;
  name_05.m_start._0_4_ = uVar2;
  name_05.m_size = (size_type)name_07;
  attribute = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                        (pSVar1,name_05,in_stack_fffffffffffffe98);
  operator____sr((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  name_06.m_start._4_4_ = uVar3;
  name_06.m_start._0_4_ = uVar2;
  name_06.m_size = (size_type)name_07;
  XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
            (pSVar1,name_06,(unsigned_long *)attribute);
  XmlWriter::ScopedElement::~ScopedElement(in_stack_fffffffffffffe90);
  std::__cxx11::string::~string((string *)(local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c9);
  operator|(Newline,Indent);
  XmlWriter::endElement(this_01,fmt);
  return;
}

Assistant:

void XmlReporter::testRunEnded( TestRunStats const& testRunStats ) {
        StreamingReporterBase::testRunEnded( testRunStats );
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes"_sr, testRunStats.totals.assertions.passed )
            .writeAttribute( "failures"_sr, testRunStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures"_sr, testRunStats.totals.assertions.failedButOk )
            .writeAttribute( "skips"_sr, testRunStats.totals.assertions.skipped );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes"_sr, testRunStats.totals.testCases.passed )
            .writeAttribute( "failures"_sr, testRunStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures"_sr, testRunStats.totals.testCases.failedButOk )
            .writeAttribute( "skips"_sr, testRunStats.totals.testCases.skipped );
        m_xml.endElement();
    }